

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O2

int stbi__create_png_image_raw
              (stbi__png *a,stbi_uc *raw,stbi__uint32 raw_len,int out_n,stbi__uint32 x,
              stbi__uint32 y,int depth,int color)

{
  undefined2 uVar1;
  int a_00;
  long lVar2;
  byte bVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  stbi_uc *psVar9;
  byte *pbVar10;
  stbi__uint32 sVar11;
  char *pcVar12;
  long lVar13;
  long lVar14;
  ulong uVar15;
  uint uVar16;
  stbi_uc *__dest;
  byte bVar17;
  ulong uVar18;
  uint uVar19;
  long lVar20;
  ulong uVar21;
  uint uVar22;
  ulong uVar24;
  long lVar25;
  ulong uVar26;
  long lVar27;
  ulong uVar28;
  ulong uVar29;
  long lVar30;
  stbi_uc *psVar31;
  byte *pbVar32;
  long in_FS_OFFSET;
  bool bVar33;
  byte *local_108;
  long local_f8;
  uint local_e8;
  ulong local_88;
  ulong uVar23;
  
  bVar33 = depth == 0x10;
  a_00 = a->s->img_n;
  lVar30 = (long)a_00;
  psVar9 = (stbi_uc *)stbi__malloc_mad3(x,y,out_n << bVar33,0);
  a->out = psVar9;
  if (psVar9 == (stbi_uc *)0x0) {
    pcVar12 = "outofmem";
  }
  else {
    iVar4 = stbi__mad3sizes_valid(a_00,x,depth,7);
    if (iVar4 == 0) {
      pcVar12 = "too large";
    }
    else {
      uVar5 = a_00 * x;
      uVar22 = uVar5 * depth + 7 >> 3;
      uVar23 = (ulong)uVar22;
      if (raw_len < (uVar22 + 1) * y) {
        pcVar12 = "not enough pixels";
      }
      else {
        lVar27 = (long)(out_n << bVar33);
        uVar6 = x * out_n;
        uVar19 = uVar6 << bVar33;
        uVar29 = (ulong)uVar19;
        uVar8 = 0;
        uVar22 = uVar6 - uVar22;
        if (7 < depth) {
          uVar22 = 0;
        }
        uVar24 = (ulong)uVar22;
        lVar25 = uVar24 - uVar29;
        uVar18 = 0;
        lVar20 = -lVar27;
        local_88 = (ulong)x;
        local_108 = raw;
        local_e8 = a_00 << bVar33;
        while( true ) {
          if (uVar18 == y) {
            if (depth < 8) {
              uVar22 = 0;
              for (uVar29 = 0; uVar29 != y; uVar29 = uVar29 + 1) {
                bVar3 = 1;
                if (color == 0) {
                  bVar3 = ""[depth];
                }
                uVar18 = (ulong)(uVar19 * (int)uVar29);
                uVar24 = (ulong)uVar22;
                psVar9 = a->out;
                if (depth == 4) {
                  lVar30 = (uVar6 - uVar23) + uVar24;
                  lVar27 = 0;
                  for (uVar8 = uVar5; 1 < (int)uVar8; uVar8 = uVar8 - 2) {
                    psVar9[lVar27 * 2 + uVar24] = (psVar9[lVar27 + lVar30] >> 4) * bVar3;
                    psVar9[lVar27 * 2 + uVar24 + 1] = (psVar9[lVar27 + lVar30] & 0xf) * bVar3;
                    lVar27 = lVar27 + 1;
                  }
                  if (uVar8 == 1) {
                    psVar9[lVar27 * 2 + uVar24] = (psVar9[lVar27 + lVar30] >> 4) * bVar3;
                  }
                }
                else {
                  pbVar32 = psVar9 + ((uVar18 + uVar6) - uVar23);
                  if (depth == 2) {
                    psVar9 = psVar9 + uVar24 + 3;
                    for (uVar8 = uVar5; 3 < (int)uVar8; uVar8 = uVar8 - 4) {
                      psVar9[-3] = (*pbVar32 >> 6) * bVar3;
                      psVar9[-2] = (*pbVar32 >> 4 & 3) * bVar3;
                      psVar9[-1] = (*pbVar32 >> 2 & 3) * bVar3;
                      bVar17 = *pbVar32;
                      pbVar32 = pbVar32 + 1;
                      *psVar9 = (bVar17 & 3) * bVar3;
                      psVar9 = psVar9 + 4;
                    }
                    if (((0 < (int)uVar8) && (psVar9[-3] = (*pbVar32 >> 6) * bVar3, uVar8 != 1)) &&
                       (psVar9[-2] = (*pbVar32 >> 4 & 3) * bVar3, uVar8 == 3)) {
                      psVar9[-1] = (*pbVar32 >> 2 & 3) * bVar3;
                    }
                  }
                  else if (depth == 1) {
                    pbVar10 = psVar9 + uVar24 + 7;
                    for (uVar8 = uVar5; 7 < (int)uVar8; uVar8 = uVar8 - 8) {
                      pbVar10[-7] = (char)*pbVar32 >> 7 & bVar3;
                      pbVar10[-6] = (char)(*pbVar32 * '\x02') >> 7 & bVar3;
                      pbVar10[-5] = (char)(*pbVar32 << 2) >> 7 & bVar3;
                      pbVar10[-4] = (char)(*pbVar32 << 3) >> 7 & bVar3;
                      pbVar10[-3] = (char)(*pbVar32 << 4) >> 7 & bVar3;
                      pbVar10[-2] = (char)(*pbVar32 << 5) >> 7 & bVar3;
                      pbVar10[-1] = (char)(*pbVar32 << 6) >> 7 & bVar3;
                      bVar17 = bVar3;
                      if ((*pbVar32 & 1) == 0) {
                        bVar17 = 0;
                      }
                      pbVar32 = pbVar32 + 1;
                      *pbVar10 = bVar17;
                      pbVar10 = pbVar10 + 8;
                    }
                    if (((((0 < (int)uVar8) &&
                          (pbVar10[-7] = (char)*pbVar32 >> 7 & bVar3, uVar8 != 1)) &&
                         ((pbVar10[-6] = (char)(*pbVar32 * '\x02') >> 7 & bVar3, 2 < uVar8 &&
                          ((pbVar10[-5] = (char)(*pbVar32 << 2) >> 7 & bVar3, uVar8 != 3 &&
                           (pbVar10[-4] = (char)(*pbVar32 << 3) >> 7 & bVar3, 4 < uVar8)))))) &&
                        (pbVar10[-3] = (char)(*pbVar32 << 4) >> 7 & bVar3, uVar8 != 5)) &&
                       (pbVar10[-2] = (char)(*pbVar32 << 5) >> 7 & bVar3, uVar8 == 7)) {
                      pbVar10[-1] = (char)(*pbVar32 << 6) >> 7 & bVar3;
                    }
                  }
                }
                if (a_00 != out_n) {
                  psVar9 = a->out;
                  iVar4 = x - 1;
                  uVar8 = x * 4;
                  uVar16 = x * 3;
                  if (a_00 == 1) {
                    uVar8 = x * 2 - 1;
                    for (iVar4 = 0; -1 < (int)((x - 1) + iVar4); iVar4 = iVar4 + -1) {
                      psVar9[uVar8 + uVar18] = 0xff;
                      uVar16 = uVar8 - 1;
                      uVar8 = uVar8 - 2;
                      psVar9[uVar16 + uVar18] = psVar9[((x - 1) + iVar4 & 0x7fffffff) + uVar18];
                    }
                  }
                  else {
                    while( true ) {
                      uVar16 = uVar16 - 3;
                      if (iVar4 < 0) break;
                      iVar4 = iVar4 + -1;
                      psVar9[(uVar8 - 1) + uVar18] = 0xff;
                      psVar9[(uVar8 - 2) + uVar18] = psVar9[(ulong)uVar16 + uVar18 + 2];
                      psVar9[(uVar8 - 3) + uVar18] = psVar9[(ulong)uVar16 + uVar18 + 1];
                      psVar9[(uVar8 - 4) + uVar18] = psVar9[uVar16 + uVar18];
                      uVar8 = uVar8 - 4;
                    }
                  }
                }
                uVar22 = uVar22 + uVar19;
              }
            }
            else if (depth == 0x10) {
              psVar9 = a->out;
              for (lVar30 = 0; uVar6 * y != (int)lVar30; lVar30 = lVar30 + 1) {
                uVar1 = swap_bytes(*(undefined2 *)(psVar9 + lVar30 * 2));
                *(undefined2 *)(psVar9 + lVar30 * 2) = uVar1;
              }
            }
            return 1;
          }
          uVar15 = (ulong)*local_108;
          if (4 < uVar15) break;
          uVar22 = local_e8;
          if (depth < 8) {
            uVar22 = 1;
            local_88 = uVar23;
          }
          if (uVar18 == 0) {
            uVar15 = (ulong)""[uVar15];
          }
          uVar21 = (ulong)uVar8;
          uVar16 = uVar19 * (int)uVar18;
          uVar26 = (ulong)(~((int)uVar22 >> 0x1f) & uVar22);
          psVar9 = a->out;
          lVar13 = -uVar29 + uVar21 + uVar24;
          for (uVar28 = 0; uVar26 != uVar28; uVar28 = uVar28 + 1) {
            switch(uVar15) {
            case 0:
            case 1:
            case 5:
            case 6:
              bVar3 = local_108[uVar28 + 1];
              break;
            case 2:
              bVar3 = psVar9[uVar28 + lVar13];
              goto LAB_0014ee0b;
            case 3:
              bVar3 = psVar9[uVar28 + lVar13] >> 1;
LAB_0014ee0b:
              bVar3 = bVar3 + local_108[uVar28 + 1];
              break;
            case 4:
              bVar3 = local_108[uVar28 + 1];
              iVar4 = stbi__paeth(0,(uint)psVar9[uVar28 + lVar13],0);
              bVar3 = (char)iVar4 + bVar3;
              break;
            default:
              goto switchD_0014edc2_default;
            }
            psVar9[uVar28 + uVar21 + uVar24] = bVar3;
switchD_0014edc2_default:
          }
          lVar13 = (long)(int)local_e8;
          if (depth == 8) {
            lVar14 = (long)out_n;
            lVar2 = lVar30;
            if (a_00 != out_n) {
              psVar9[lVar30 + (ulong)uVar16] = 0xff;
            }
LAB_0014ee71:
            local_108 = local_108 + lVar2 + 1;
            lVar2 = lVar14 + (ulong)uVar16;
          }
          else {
            if (depth == 0x10) {
              lVar14 = lVar27;
              lVar2 = lVar13;
              if (a_00 != out_n) {
                (psVar9 + lVar13 + (ulong)uVar16)[0] = 0xff;
                (psVar9 + lVar13 + (ulong)uVar16)[1] = 0xff;
              }
              goto LAB_0014ee71;
            }
            local_108 = local_108 + 2;
            lVar2 = uVar24 + uVar16 + 1;
            lVar14 = 1;
          }
          __dest = psVar9 + lVar2;
          if (a_00 == out_n || depth < 8) {
            uVar16 = ((int)local_88 + -1) * uVar22;
            if ((byte)uVar15 < 7) {
              lVar13 = (long)(int)uVar22;
              uVar7 = (int)uVar16 >> 0x1f;
              switch(uVar15) {
              case 0:
                memcpy(__dest,local_108,(long)(int)uVar16);
                break;
              case 1:
                for (uVar15 = 0; (~uVar7 & uVar16) != uVar15; uVar15 = uVar15 + 1) {
                  __dest[uVar15] = __dest[uVar15 - lVar13] + local_108[uVar15];
                }
                break;
              case 2:
                for (uVar15 = 0; (~uVar7 & uVar16) != uVar15; uVar15 = uVar15 + 1) {
                  __dest[uVar15] = psVar9[uVar15 + lVar14 + uVar21 + lVar25] + local_108[uVar15];
                }
                break;
              case 3:
                for (uVar15 = 0; (~uVar7 & uVar16) != uVar15; uVar15 = uVar15 + 1) {
                  __dest[uVar15] =
                       (char)((uint)__dest[uVar15 - lVar13] +
                              (uint)psVar9[uVar15 + lVar14 + uVar21 + lVar25] >> 1) +
                       local_108[uVar15];
                }
                break;
              case 4:
                uVar15 = (ulong)(~uVar7 & uVar16);
                pbVar10 = psVar9 + lVar14 + uVar21 + lVar25;
                pbVar32 = local_108;
                while (bVar33 = uVar15 != 0, uVar15 = uVar15 - 1, bVar33) {
                  bVar3 = *pbVar32;
                  iVar4 = stbi__paeth((uint)__dest[-lVar13],(uint)*pbVar10,(uint)pbVar10[-lVar13]);
                  pbVar10 = pbVar10 + 1;
                  pbVar32 = pbVar32 + 1;
                  *__dest = (char)iVar4 + bVar3;
                  __dest = __dest + 1;
                }
                break;
              case 5:
                for (uVar15 = 0; (~uVar7 & uVar16) != uVar15; uVar15 = uVar15 + 1) {
                  __dest[uVar15] = (__dest[uVar15 - lVar13] >> 1) + local_108[uVar15];
                }
                break;
              case 6:
                for (uVar15 = 0; (~uVar7 & uVar16) != uVar15; uVar15 = uVar15 + 1) {
                  __dest[uVar15] = __dest[uVar15 - lVar13] + local_108[uVar15];
                }
              }
            }
            local_108 = local_108 + (int)uVar16;
          }
          else {
            if ((byte)uVar15 < 7) {
              psVar31 = psVar9 + lVar14 + -uVar29 + uVar24 + uVar16;
              switch(uVar15) {
              case 0:
                sVar11 = x;
                while (sVar11 = sVar11 - 1, sVar11 != 0) {
                  for (uVar15 = 0; uVar26 != uVar15; uVar15 = uVar15 + 1) {
                    __dest[uVar15] = local_108[uVar15];
                  }
                  __dest[lVar13] = 0xff;
                  local_108 = local_108 + lVar13;
                  __dest = __dest + lVar27;
                }
                break;
              case 1:
                sVar11 = x;
                while (sVar11 = sVar11 - 1, sVar11 != 0) {
                  for (uVar15 = 0; uVar26 != uVar15; uVar15 = uVar15 + 1) {
                    __dest[uVar15] = __dest[uVar15 + lVar20] + local_108[uVar15];
                  }
                  __dest[lVar13] = 0xff;
                  local_108 = local_108 + lVar13;
                  __dest = __dest + lVar27;
                }
                break;
              case 2:
                sVar11 = x;
                while (sVar11 = sVar11 - 1, sVar11 != 0) {
                  for (uVar15 = 0; uVar26 != uVar15; uVar15 = uVar15 + 1) {
                    __dest[uVar15] = psVar31[uVar15] + local_108[uVar15];
                  }
                  __dest[lVar13] = 0xff;
                  local_108 = local_108 + lVar13;
                  __dest = __dest + lVar27;
                  psVar31 = psVar31 + lVar27;
                }
                break;
              case 3:
                sVar11 = x;
                while (sVar11 = sVar11 - 1, sVar11 != 0) {
                  for (uVar15 = 0; uVar26 != uVar15; uVar15 = uVar15 + 1) {
                    __dest[uVar15] =
                         (char)((uint)__dest[uVar15 + lVar20] + (uint)psVar31[uVar15] >> 1) +
                         local_108[uVar15];
                  }
                  __dest[lVar13] = 0xff;
                  local_108 = local_108 + lVar13;
                  __dest = __dest + lVar27;
                  psVar31 = psVar31 + lVar27;
                }
                break;
              case 4:
                local_f8 = (long)__dest + lVar20;
                psVar9 = psVar9 + lVar14 + uVar21 + ((uVar24 - lVar27) - uVar29);
                sVar11 = x;
                while (sVar11 = sVar11 - 1, sVar11 != 0) {
                  for (uVar15 = 0; uVar26 != uVar15; uVar15 = uVar15 + 1) {
                    bVar3 = local_108[uVar15];
                    iVar4 = stbi__paeth((uint)*(byte *)(local_f8 + uVar15),(uint)psVar31[uVar15],
                                        (uint)psVar9[uVar15]);
                    __dest[uVar15] = (char)iVar4 + bVar3;
                  }
                  __dest[lVar13] = 0xff;
                  local_108 = local_108 + lVar13;
                  local_f8 = local_f8 + lVar27;
                  __dest = __dest + lVar27;
                  psVar31 = psVar31 + lVar27;
                  psVar9 = psVar9 + lVar27;
                }
                break;
              case 5:
                sVar11 = x;
                while (sVar11 = sVar11 - 1, sVar11 != 0) {
                  for (uVar15 = 0; uVar26 != uVar15; uVar15 = uVar15 + 1) {
                    __dest[uVar15] = (__dest[uVar15 + lVar20] >> 1) + local_108[uVar15];
                  }
                  __dest[lVar13] = 0xff;
                  local_108 = local_108 + lVar13;
                  __dest = __dest + lVar27;
                }
                break;
              case 6:
                sVar11 = x;
                while (sVar11 = sVar11 - 1, sVar11 != 0) {
                  for (uVar15 = 0; uVar26 != uVar15; uVar15 = uVar15 + 1) {
                    __dest[uVar15] = __dest[uVar15 + lVar20] + local_108[uVar15];
                  }
                  __dest[lVar13] = 0xff;
                  local_108 = local_108 + lVar13;
                  __dest = __dest + lVar27;
                }
              }
            }
            if (depth == 0x10) {
              psVar9 = a->out + (long)(int)(local_e8 + 1) + uVar21;
              sVar11 = x;
              while (bVar33 = sVar11 != 0, sVar11 = sVar11 - 1, bVar33) {
                *psVar9 = 0xff;
                psVar9 = psVar9 + lVar27;
              }
            }
          }
          uVar18 = uVar18 + 1;
          uVar8 = uVar19 + uVar8;
          local_e8 = uVar22;
        }
        pcVar12 = "invalid filter";
      }
    }
  }
  *(char **)(in_FS_OFFSET + -0x10) = pcVar12;
  return 0;
}

Assistant:

static int stbi__create_png_image_raw(stbi__png *a, stbi_uc *raw, stbi__uint32 raw_len, int out_n, stbi__uint32 x, stbi__uint32 y, int depth, int color)
{
   int bytes = (depth == 16? 2 : 1);
   stbi__context *s = a->s;
   stbi__uint32 i,j,stride = x*out_n*bytes;
   stbi__uint32 img_len, img_width_bytes;
   int k;
   int img_n = s->img_n; // copy it into a local for later

   int output_bytes = out_n*bytes;
   int filter_bytes = img_n*bytes;
   int width = x;

   STBI_ASSERT(out_n == s->img_n || out_n == s->img_n+1);
   a->out = (stbi_uc *) stbi__malloc_mad3(x, y, output_bytes, 0); // extra bytes to write off the end into
   if (!a->out) return stbi__err("outofmem", "Out of memory");

   if (!stbi__mad3sizes_valid(img_n, x, depth, 7)) return stbi__err("too large", "Corrupt PNG");
   img_width_bytes = (((img_n * x * depth) + 7) >> 3);
   img_len = (img_width_bytes + 1) * y;

   // we used to check for exact match between raw_len and img_len on non-interlaced PNGs,
   // but issue #276 reported a PNG in the wild that had extra data at the end (all zeros),
   // so just check for raw_len < img_len always.
   if (raw_len < img_len) return stbi__err("not enough pixels","Corrupt PNG");

   for (j=0; j < y; ++j) {
      stbi_uc *cur = a->out + stride*j;
      stbi_uc *prior;
      int filter = *raw++;

      if (filter > 4)
         return stbi__err("invalid filter","Corrupt PNG");

      if (depth < 8) {
         STBI_ASSERT(img_width_bytes <= x);
         cur += x*out_n - img_width_bytes; // store output to the rightmost img_len bytes, so we can decode in place
         filter_bytes = 1;
         width = img_width_bytes;
      }
      prior = cur - stride; // bugfix: need to compute this after 'cur +=' computation above

      // if first row, use special filter that doesn't sample previous row
      if (j == 0) filter = first_row_filter[filter];

      // handle first byte explicitly
      for (k=0; k < filter_bytes; ++k) {
         switch (filter) {
            case STBI__F_none       : cur[k] = raw[k]; break;
            case STBI__F_sub        : cur[k] = raw[k]; break;
            case STBI__F_up         : cur[k] = STBI__BYTECAST(raw[k] + prior[k]); break;
            case STBI__F_avg        : cur[k] = STBI__BYTECAST(raw[k] + (prior[k]>>1)); break;
            case STBI__F_paeth      : cur[k] = STBI__BYTECAST(raw[k] + stbi__paeth(0,prior[k],0)); break;
            case STBI__F_avg_first  : cur[k] = raw[k]; break;
            case STBI__F_paeth_first: cur[k] = raw[k]; break;
         }
      }

      if (depth == 8) {
         if (img_n != out_n)
            cur[img_n] = 255; // first pixel
         raw += img_n;
         cur += out_n;
         prior += out_n;
      } else if (depth == 16) {
         if (img_n != out_n) {
            cur[filter_bytes]   = 255; // first pixel top byte
            cur[filter_bytes+1] = 255; // first pixel bottom byte
         }
         raw += filter_bytes;
         cur += output_bytes;
         prior += output_bytes;
      } else {
         raw += 1;
         cur += 1;
         prior += 1;
      }

      // this is a little gross, so that we don't switch per-pixel or per-component
      if (depth < 8 || img_n == out_n) {
         int nk = (width - 1)*filter_bytes;
         #define STBI__CASE(f) \
             case f:     \
                for (k=0; k < nk; ++k)
         switch (filter) {
            // "none" filter turns into a memcpy here; make that explicit.
            case STBI__F_none:         memcpy(cur, raw, nk); break;
            STBI__CASE(STBI__F_sub)          { cur[k] = STBI__BYTECAST(raw[k] + cur[k-filter_bytes]); } break;
            STBI__CASE(STBI__F_up)           { cur[k] = STBI__BYTECAST(raw[k] + prior[k]); } break;
            STBI__CASE(STBI__F_avg)          { cur[k] = STBI__BYTECAST(raw[k] + ((prior[k] + cur[k-filter_bytes])>>1)); } break;
            STBI__CASE(STBI__F_paeth)        { cur[k] = STBI__BYTECAST(raw[k] + stbi__paeth(cur[k-filter_bytes],prior[k],prior[k-filter_bytes])); } break;
            STBI__CASE(STBI__F_avg_first)    { cur[k] = STBI__BYTECAST(raw[k] + (cur[k-filter_bytes] >> 1)); } break;
            STBI__CASE(STBI__F_paeth_first)  { cur[k] = STBI__BYTECAST(raw[k] + stbi__paeth(cur[k-filter_bytes],0,0)); } break;
         }
         #undef STBI__CASE
         raw += nk;
      } else {
         STBI_ASSERT(img_n+1 == out_n);
         #define STBI__CASE(f) \
             case f:     \
                for (i=x-1; i >= 1; --i, cur[filter_bytes]=255,raw+=filter_bytes,cur+=output_bytes,prior+=output_bytes) \
                   for (k=0; k < filter_bytes; ++k)
         switch (filter) {
            STBI__CASE(STBI__F_none)         { cur[k] = raw[k]; } break;
            STBI__CASE(STBI__F_sub)          { cur[k] = STBI__BYTECAST(raw[k] + cur[k- output_bytes]); } break;
            STBI__CASE(STBI__F_up)           { cur[k] = STBI__BYTECAST(raw[k] + prior[k]); } break;
            STBI__CASE(STBI__F_avg)          { cur[k] = STBI__BYTECAST(raw[k] + ((prior[k] + cur[k- output_bytes])>>1)); } break;
            STBI__CASE(STBI__F_paeth)        { cur[k] = STBI__BYTECAST(raw[k] + stbi__paeth(cur[k- output_bytes],prior[k],prior[k- output_bytes])); } break;
            STBI__CASE(STBI__F_avg_first)    { cur[k] = STBI__BYTECAST(raw[k] + (cur[k- output_bytes] >> 1)); } break;
            STBI__CASE(STBI__F_paeth_first)  { cur[k] = STBI__BYTECAST(raw[k] + stbi__paeth(cur[k- output_bytes],0,0)); } break;
         }
         #undef STBI__CASE

         // the loop above sets the high byte of the pixels' alpha, but for
         // 16 bit png files we also need the low byte set. we'll do that here.
         if (depth == 16) {
            cur = a->out + stride*j; // start at the beginning of the row again
            for (i=0; i < x; ++i,cur+=output_bytes) {
               cur[filter_bytes+1] = 255;
            }
         }
      }